

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O3

void __thiscall re2::Regexp::Walker<re2::Regexp_*>::Reset(Walker<re2::Regexp_*> *this)

{
  stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
  *psVar1;
  _Map_pointer ppWVar2;
  WalkState<re2::Regexp_*> *pWVar3;
  WalkState<re2::Regexp_*> *pWVar4;
  LogMessage local_1a0;
  
  psVar1 = this->stack_;
  if ((psVar1 != (stack<re2::WalkState<re2::Regexp_*>,_std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>_>
                  *)0x0) &&
     (ppWVar2 = (psVar1->c).
                super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node,
     ((long)(psVar1->c).
            super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
      (long)(psVar1->c).
            super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) * -0x5555555555555555 +
     (((long)ppWVar2 -
       (long)(psVar1->c).
             super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
     (ulong)(ppWVar2 == (_Map_pointer)0x0)) * 10 !=
     ((long)(psVar1->c).
            super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_last -
      (long)(psVar1->c).
            super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * 0x5555555555555555)) {
    LogMessage::LogMessage
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/walker-inl.h"
               ,0x97);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0.str_,"Stack not empty.",0x10);
    LogMessage::~LogMessage(&local_1a0);
    while( true ) {
      psVar1 = this->stack_;
      ppWVar2 = (psVar1->c).
                super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      pWVar4 = (psVar1->c).
               super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pWVar3 = (psVar1->c).
               super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (((long)pWVar4 - (long)pWVar3 >> 4) * -0x5555555555555555 +
          (((long)ppWVar2 -
            (long)(psVar1->c).
                  super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(ppWVar2 == (_Map_pointer)0x0)) * 10 ==
          ((long)(psVar1->c).
                 super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)(psVar1->c).
                 super__Deque_base<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) * 0x5555555555555555) break;
      if (pWVar4 == pWVar3) {
        pWVar4 = ppWVar2[-1] + 10;
      }
      operator_delete(pWVar4[-1].child_args);
      std::deque<re2::WalkState<re2::Regexp_*>,_std::allocator<re2::WalkState<re2::Regexp_*>_>_>::
      pop_back(&this->stack_->c);
    }
  }
  return;
}

Assistant:

void Regexp::Walker<T>::Reset() {
  if (stack_ && stack_->size() > 0) {
    LOG(DFATAL) << "Stack not empty.";
    while (stack_->size() > 0) {
      delete stack_->top().child_args;
      stack_->pop();
    }
  }
}